

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::internal::TracingMuxerImpl::DestroyTracingSession
          (TracingMuxerImpl *this,TracingSessionGlobalID session_id)

{
  pointer pRVar1;
  ConsumerImpl *this_00;
  pointer puVar2;
  RegisteredBackend *backend;
  pointer pRVar3;
  
  pRVar3 = (this->backends_).
           super__Vector_base<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->backends_).
           super__Vector_base<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pRVar3 == pRVar1) {
      return;
    }
    puVar2 = (pRVar3->consumers).
             super__Vector_base<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>,_std::allocator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (puVar2 == (pRVar3->consumers).
                    super__Vector_base<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>,_std::allocator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002f0a7e;
      this_00 = (puVar2->_M_t).
                super___uniq_ptr_impl<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>
                ._M_t.
                super__Tuple_impl<0UL,_perfetto::internal::TracingMuxerImpl::ConsumerImpl_*,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>
                .super__Head_base<0UL,_perfetto::internal::TracingMuxerImpl::ConsumerImpl_*,_false>.
                _M_head_impl;
      puVar2 = puVar2 + 1;
    } while (this_00->session_id_ != session_id);
    ConsumerImpl::Disconnect(this_00);
LAB_002f0a7e:
    pRVar3 = pRVar3 + 1;
  } while( true );
}

Assistant:

void TracingMuxerImpl::DestroyTracingSession(
    TracingSessionGlobalID session_id) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  for (RegisteredBackend& backend : backends_) {
    // We need to find the consumer (if any) and call Disconnect as we destroy
    // the tracing session. We can't call Disconnect() inside this for loop
    // because in the in-process case this will end up to a synchronous call to
    // OnConsumerDisconnect which will invalidate all the iterators to
    // |backend.consumers|.
    ConsumerImpl* consumer = nullptr;
    for (auto& con : backend.consumers) {
      if (con->session_id_ == session_id) {
        consumer = con.get();
        break;
      }
    }
    if (consumer) {
      // We broke out of the loop above on the assumption that each backend will
      // only have a single consumer per session. This DCHECK ensures that
      // this is the case.
      PERFETTO_DCHECK(
          std::count_if(backend.consumers.begin(), backend.consumers.end(),
                        [session_id](const std::unique_ptr<ConsumerImpl>& con) {
                          return con->session_id_ == session_id;
                        }) == 1u);
      consumer->Disconnect();
    }
  }
}